

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_dependentFunctionType_primitiveAnalyzeAndTypeCheckFunctionApplicationNode
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  sysbvm_tuple_t sVar2;
  size_t i;
  long lVar3;
  ulong uVar4;
  size_t i_1;
  ulong uVar5;
  ulong local_1c8;
  sysbvm_tuple_t local_1c0;
  sysbvm_tuple_t local_1b8;
  sysbvm_tuple_t sStack_1b0;
  sysbvm_tuple_t local_1a8;
  sysbvm_tuple_t sStack_1a0;
  sysbvm_tuple_t local_198;
  sysbvm_tuple_t sStack_190;
  sysbvm_tuple_t local_188;
  sysbvm_tuple_t sStack_180;
  ulong local_178;
  sysbvm_astFunctionApplicationNode_t **local_170;
  long local_168;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameRecord_t local_148;
  undefined8 local_138;
  sysbvm_tuple_t *local_130;
  sysbvm_stackFrameFunctionActivationRecord_t functionActivationRecord;
  
  if (argumentCount != 3) {
    sysbvm_error_argumentCountMismatch(3,argumentCount);
  }
  local_188 = 0;
  sStack_180 = 0;
  local_198 = 0;
  sStack_190 = 0;
  local_1a8 = 0;
  sStack_1a0 = 0;
  local_1b8 = 0;
  sStack_1b0 = 0;
  local_1c0 = arguments[1];
  local_1c8 = 0;
  memset(&functionActivationRecord,0,0xf8);
  functionActivationRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_FUNCTION_ACTIVATION;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&functionActivationRecord);
  local_148.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_148.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_148._12_4_ = 0;
  local_138 = 9;
  local_130 = &local_1c0;
  sysbvm_stackFrame_pushRecord(&local_148);
  sourcePositionRecord.previous = (sysbvm_stackFrameRecord_t *)0x0;
  sourcePositionRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  sourcePositionRecord.sourcePosition = *(sysbvm_tuple_t *)(local_1c0 + 0x10);
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
  local_1b8 = sysbvm_functionActivationEnvironment_createForDependentFunctionType
                        (context,0,*arguments);
  uVar5 = *(ulong *)(*arguments + 0x108);
  if ((uVar5 & 0xf) == 0 && uVar5 != 0) {
    local_1c8 = (ulong)(*(uint *)(uVar5 + 0xc) >> 3);
  }
  uVar5 = *(ulong *)(*arguments + 0xf8);
  if (uVar5 == 0 || (uVar5 & 0xf) != 0) {
    uVar5 = (long)uVar5 >> 4;
  }
  else {
    uVar5 = *(ulong *)(uVar5 + 0x10);
  }
  if (((uVar5 & 2) != 0) && (local_1c8 == 0)) {
    sysbvm_error("Variadic functions at least one extra argument node.");
  }
  uVar4 = *(ulong *)(local_1c0 + 0x30);
  if ((uVar4 & 0xf) == 0 && uVar4 != 0) {
    uVar4 = (ulong)(*(uint *)(uVar4 + 0xc) >> 3);
  }
  else {
    uVar4 = 0;
  }
  local_170 = (sysbvm_astFunctionApplicationNode_t **)(arguments + 1);
  local_168 = local_1c8 - (((uint)uVar5 & 2) >> 1);
  local_178 = uVar5;
  local_188 = sysbvm_array_create(context,uVar4);
  uVar5 = 0;
  for (lVar3 = 0; local_168 != lVar3; lVar3 = lVar3 + 1) {
    uVar1 = *(ulong *)(*arguments + 0x108);
    if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
      sStack_1b0 = *(sysbvm_tuple_t *)(uVar1 + 0x10 + lVar3 * 8);
    }
    else {
      sStack_1b0 = 0;
    }
    if (((local_1c8 & 0xf) == 0 && local_1c8 != 0) && (*(long *)(local_1c8 + 0x28) == 0x1f)) {
      sysbvm_error("TODO: Support forall argument types");
    }
    else {
      if (uVar4 <= uVar5) {
        sysbvm_error("Function application is missing required arguments.");
      }
      uVar1 = *(ulong *)(local_1c0 + 0x30);
      if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
        local_1a8 = *(sysbvm_tuple_t *)(uVar1 + 0x10 + uVar5 * 8);
      }
      else {
        local_1a8 = 0;
      }
      sStack_180 = sysbvm_interpreter_evaluateArgumentNodeTypeInEnvironment
                             (context,sStack_1b0,&local_1b8);
      sStack_190 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                             (context,local_1a8,sStack_180,arguments[2]);
      if ((local_188 & 0xf) == 0 && local_188 != 0) {
        *(sysbvm_tuple_t *)(local_188 + 0x10 + uVar5 * 8) = sStack_190;
      }
      sStack_1a0 = sysbvm_dependentFunctionType_getOrCreateDependentApplicationValueForNode
                             (context,sStack_190);
      uVar1 = *(ulong *)(local_1b8 + 0xa0);
      if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
        *(sysbvm_tuple_t *)(uVar1 + 0x10 + lVar3 * 8) = sStack_1a0;
      }
      uVar5 = uVar5 + 1;
    }
  }
  if (((local_178 & 2) == 0) && (uVar5 != uVar4)) {
    sysbvm_error("Function application is not receiving the expected number of arguments.");
  }
  for (; uVar5 < uVar4; uVar5 = uVar5 + 1) {
    uVar1 = *(ulong *)(local_1c0 + 0x30);
    if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
      local_1a8 = *(sysbvm_tuple_t *)(uVar1 + 0x10 + uVar5 * 8);
    }
    else {
      local_1a8 = 0;
    }
    sStack_190 = sysbvm_interpreter_analyzeASTWithDecayedTypeWithEnvironment
                           (context,local_1a8,arguments[2]);
    if ((local_188 & 0xf) == 0 && local_188 != 0) {
      *(sysbvm_tuple_t *)(local_188 + 0x10 + uVar5 * 8) = sStack_190;
    }
  }
  *(sysbvm_tuple_t *)(local_1c0 + 0x30) = local_188;
  if (*(sysbvm_tuple_t *)(*arguments + 0x110) != 0) {
    local_198 = sysbvm_interpreter_evaluateASTWithEnvironment
                          (context,*(sysbvm_tuple_t *)(*arguments + 0x110),local_1b8);
  }
  local_198 = sysbvm_type_canonicalizeDependentResultType(context,local_198);
  uVar5 = *(ulong *)(local_1c0 + 0x38);
  if (uVar5 == 0 || (uVar5 & 0xf) != 0) {
    lVar3 = (long)uVar5 >> 4;
  }
  else {
    lVar3 = *(long *)(uVar5 + 0x10);
  }
  *(ulong *)(local_1c0 + 0x38) = lVar3 << 4 | 0x3b;
  *(sysbvm_tuple_t *)(local_1c0 + 0x20) = local_198;
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
  sysbvm_stackFrame_popRecord(&local_148);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&functionActivationRecord);
  sVar2 = sysbvm_astFunctionApplicationNode_optimizePureApplication(context,local_170);
  return sVar2;
}

Assistant:

static sysbvm_tuple_t sysbvm_dependentFunctionType_primitiveAnalyzeAndTypeCheckFunctionApplicationNode(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 3) sysbvm_error_argumentCountMismatch(3, argumentCount);

    sysbvm_dependentFunctionType_t **dependentFunctionType = (sysbvm_dependentFunctionType_t **)&arguments[0];
    sysbvm_tuple_t *node = &arguments[1];
    sysbvm_tuple_t *environment = &arguments[2];

    struct {
        sysbvm_astFunctionApplicationNode_t *functionApplicationNode;

        sysbvm_tuple_t applicationEnvironment;
        sysbvm_tuple_t argumentNode;

        sysbvm_tuple_t applicationArgumentNode;
        sysbvm_tuple_t applicationArgumentValue;
        sysbvm_tuple_t resultType;

        sysbvm_tuple_t analyzedArgument;
        sysbvm_tuple_t analyzedArguments;
        sysbvm_tuple_t expectedArgumentType;
    } gcFrame = {
        .functionApplicationNode = (sysbvm_astFunctionApplicationNode_t*)*node,
    };

    sysbvm_stackFrameFunctionActivationRecord_t functionActivationRecord = {
        .type = SYSBVM_STACK_FRAME_RECORD_TYPE_FUNCTION_ACTIVATION,
    };
    sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t*)&functionActivationRecord); 
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, gcFrame.functionApplicationNode->super.sourcePosition);

    gcFrame.applicationEnvironment = sysbvm_functionActivationEnvironment_createForDependentFunctionType(context, SYSBVM_NULL_TUPLE, (sysbvm_tuple_t)*dependentFunctionType);

    size_t argumentNodeCount = sysbvm_array_getSize((*dependentFunctionType)->argumentNodes);
    sysbvm_bitflags_t flags = sysbvm_tuple_bitflags_decode((*dependentFunctionType)->super.functionFlags);
    bool isVariadic = (flags & SYSBVM_FUNCTION_FLAGS_VARIADIC) != 0;
    if(isVariadic && argumentNodeCount == 0)
        sysbvm_error("Variadic functions at least one extra argument node.");
    
    size_t directEvaluationArgumentNodeCount = isVariadic ? argumentNodeCount - 1 : argumentNodeCount;

    size_t applicationArgumentCount = sysbvm_array_getSize(gcFrame.functionApplicationNode->arguments);
    size_t sourceArgumentIndex = 0;

    gcFrame.analyzedArguments = sysbvm_array_create(context, applicationArgumentCount);
    for(size_t i = 0; i < directEvaluationArgumentNodeCount; ++i)
    {
        gcFrame.argumentNode = sysbvm_array_at((*dependentFunctionType)->argumentNodes, i);
        if(sysbvm_astArgumentNode_isForAll(argumentNodeCount))
        {
            sysbvm_error("TODO: Support forall argument types");
        }
        else
        {
            if(sourceArgumentIndex >= applicationArgumentCount)
                sysbvm_error("Function application is missing required arguments.");

            gcFrame.applicationArgumentNode = sysbvm_array_at(gcFrame.functionApplicationNode->arguments, sourceArgumentIndex);
            gcFrame.expectedArgumentType = sysbvm_interpreter_evaluateArgumentNodeTypeInEnvironment(context, gcFrame.argumentNode, &gcFrame.applicationEnvironment);
            gcFrame.analyzedArgument = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.applicationArgumentNode, gcFrame.expectedArgumentType, *environment);
            sysbvm_array_atPut(gcFrame.analyzedArguments, sourceArgumentIndex, gcFrame.analyzedArgument);
            gcFrame.applicationArgumentValue = sysbvm_dependentFunctionType_getOrCreateDependentApplicationValueForNode(context, gcFrame.analyzedArgument);
            sysbvm_interpreter_bindArgumentNodeValueInEnvironment(context, i, &gcFrame.applicationEnvironment, gcFrame.applicationArgumentValue);
            ++sourceArgumentIndex;
        }
    }

    if(!isVariadic && sourceArgumentIndex != applicationArgumentCount)
        sysbvm_error("Function application is not receiving the expected number of arguments.");

    for(size_t i = sourceArgumentIndex; i < applicationArgumentCount; ++i)
    {
        gcFrame.applicationArgumentNode = sysbvm_array_at(gcFrame.functionApplicationNode->arguments, i);
        gcFrame.analyzedArgument = sysbvm_interpreter_analyzeASTWithDecayedTypeWithEnvironment(context, gcFrame.applicationArgumentNode, *environment);
        sysbvm_array_atPut(gcFrame.analyzedArguments, i, gcFrame.analyzedArgument);
    }

    gcFrame.functionApplicationNode->arguments = gcFrame.analyzedArguments;

    if((*dependentFunctionType)->resultTypeNode)
        gcFrame.resultType = sysbvm_interpreter_evaluateASTWithEnvironment(context, (*dependentFunctionType)->resultTypeNode, gcFrame.applicationEnvironment);
    gcFrame.resultType = sysbvm_type_canonicalizeDependentResultType(context, gcFrame.resultType);
    gcFrame.functionApplicationNode->applicationFlags = sysbvm_tuple_bitflags_encode(sysbvm_tuple_bitflags_decode(gcFrame.functionApplicationNode->applicationFlags)
        | SYSBVM_FUNCTION_APPLICATION_FLAGS_NO_TYPECHECK | SYSBVM_FUNCTION_APPLICATION_FLAGS_VARIADIC_EXPANDED);
    gcFrame.functionApplicationNode->super.analyzedType = gcFrame.resultType;

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t*)&functionActivationRecord);  
    return sysbvm_astFunctionApplicationNode_optimizePureApplication(context, (sysbvm_astFunctionApplicationNode_t**)node);
}